

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O0

void __thiscall NaPNSwapper::post_action(NaPNSwapper *this)

{
  bool bVar1;
  int iVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  NaPetriCnInput *in_RDI;
  NaPetriCnOutput *in_stack_ffffffffffffffe8;
  
  pNVar3 = NaPetriCnInput::data(in_RDI);
  iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
  if (*(double *)CONCAT44(extraout_var,iVar2) <= 0.0) {
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffe8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffe8), !bVar1)) {
      NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x153820);
      NaPetriCnInput::commit_data(in_RDI);
    }
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffe8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffe8), !bVar1)) {
      NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x15386c);
      NaPetriCnInput::commit_data(in_RDI);
    }
  }
  else {
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffe8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffe8), !bVar1)) {
      NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x153783);
      NaPetriCnInput::commit_data(in_RDI);
    }
    bVar1 = NaPetriCnInput::is_waiting((NaPetriCnInput *)in_stack_ffffffffffffffe8);
    if ((!bVar1) && (bVar1 = NaPetriCnOutput::is_waiting(in_stack_ffffffffffffffe8), !bVar1)) {
      NaPetriCnOutput::commit_data((NaPetriCnOutput *)0x1537cf);
      NaPetriCnInput::commit_data(in_RDI);
    }
  }
  NaPetriCnInput::commit_data(in_RDI);
  return;
}

Assistant:

void
NaPNSwapper::post_action ()
{
    if(turn.data()[0] > 0){
        // Copy input to output
        if(!in.is_waiting() && !out.is_waiting()){
            out.commit_data();
            in.commit_data();
        }
        if(!in2.is_waiting() && !out2.is_waiting()){
            out2.commit_data();
            in2.commit_data();
        }
    }else{
        // Copy crossed input to output
        if(!in2.is_waiting() && !out.is_waiting()){
            out.commit_data();
            in2.commit_data();
        }
        if(!in.is_waiting() && !out2.is_waiting()){
            out2.commit_data();
            in.commit_data();
        }
    }
    turn.commit_data();
}